

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilCanon.c
# Opt level: O0

void Map_Var3Test(void)

{
  uint local_3c;
  int Count;
  uint uTruth;
  char *pfRes;
  uint *ptRes;
  int i;
  char *pCounters;
  char **uPhases;
  uint *uCanons;
  
  Extra_Truth3VarN((uint **)&uPhases,(char ***)&pCounters,(char **)&stack0xffffffffffffffe0);
  for (ptRes._4_4_ = 0; (int)ptRes._4_4_ < 0x100; ptRes._4_4_ = ptRes._4_4_ + 1) {
    local_3c = ptRes._4_4_;
    Extra_TruthCanonFastN(5,3,&local_3c,(uint **)&pfRes,(char **)&Count);
  }
  return;
}

Assistant:

void Map_Var3Test()
{
    extern void Extra_Truth3VarN( unsigned ** puCanons, char *** puPhases, char ** ppCounters );

    unsigned * uCanons;
    char ** uPhases;
    char * pCounters;
    int i;
    unsigned * ptRes;
    char * pfRes;
    unsigned uTruth;
    int Count;

    Extra_Truth3VarN( &uCanons, &uPhases, &pCounters );

    for ( i = 0; i < 256; i++ )
    {
        uTruth = i;
        Count =  Extra_TruthCanonFastN( 5, 3, &uTruth, &ptRes, &pfRes );
    }
}